

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

void __thiscall TPZVec<Fad<long_double>_>::Resize(TPZVec<Fad<long_double>_> *this,int64_t newsize)

{
  undefined8 *puVar1;
  Fad<long_double> *pFVar2;
  undefined1 auVar3 [16];
  ostream *poVar4;
  ulong uVar5;
  ulong uVar6;
  void *pvVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  
  if (newsize < 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize: ");
    poVar4 = std::ostream::_M_insert<long>((long)poVar4);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::ostream::flush();
  }
  lVar9 = this->fNElements;
  if (lVar9 != newsize) {
    if (newsize == 0) {
      this->fNElements = 0;
      this->fNAlloc = 0;
      pFVar2 = this->fStore;
      if (pFVar2 != (Fad<long_double> *)0x0) {
        lVar9 = *(long *)((long)&pFVar2[-1].defaultVal + 8);
        if (lVar9 != 0) {
          lVar8 = lVar9 * 0x30;
          do {
            Vector<long_double>::destroy((Vector<long_double> *)((long)pFVar2 + lVar8 + -0x20));
            lVar8 = lVar8 + -0x30;
          } while (lVar8 != 0);
        }
        operator_delete__(&pFVar2[-1].defaultVal,lVar9 * 0x30 + 0x10);
      }
      this->fStore = (Fad<long_double> *)0x0;
    }
    else {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = newsize;
      uVar5 = SUB168(auVar3 * ZEXT816(0x30),0);
      uVar6 = uVar5 + 0x10;
      if (0xffffffffffffffef < uVar5) {
        uVar6 = 0xffffffffffffffff;
      }
      uVar5 = 0xffffffffffffffff;
      if (SUB168(auVar3 * ZEXT816(0x30),8) == 0) {
        uVar5 = uVar6;
      }
      pvVar7 = operator_new__(uVar5);
      *(int64_t *)((long)pvVar7 + 8) = newsize;
      lVar8 = 0;
      do {
        *(longdouble *)((long)pvVar7 + lVar8 + 0x10) = (longdouble)0;
        *(undefined4 *)((long)pvVar7 + lVar8 + 0x20) = 0;
        *(undefined2 *)((long)pvVar7 + lVar8 + 0x38) = 0;
        puVar1 = (undefined8 *)((long)pvVar7 + lVar8 + 0x28);
        *puVar1 = 0;
        puVar1[1] = 0;
        lVar8 = lVar8 + 0x30;
      } while (newsize * 0x30 - lVar8 != 0);
      if (newsize <= lVar9) {
        lVar9 = newsize;
      }
      lVar8 = 0;
      if (lVar9 < 1) {
        lVar9 = lVar8;
      }
      while( true ) {
        pFVar2 = this->fStore;
        bVar10 = lVar9 == 0;
        lVar9 = lVar9 + -1;
        if (bVar10) break;
        Fad<long_double>::operator=
                  ((Fad<long_double> *)
                   ((long)&((Fad<long_double> *)((long)pvVar7 + 0x10))->val_ + lVar8),
                   (Fad<long_double> *)((long)&pFVar2->val_ + lVar8));
        lVar8 = lVar8 + 0x30;
      }
      if (pFVar2 != (Fad<long_double> *)0x0) {
        lVar9 = *(long *)((long)&pFVar2[-1].defaultVal + 8);
        if (lVar9 != 0) {
          lVar8 = lVar9 * 0x30;
          do {
            Vector<long_double>::destroy((Vector<long_double> *)((long)pFVar2 + lVar8 + -0x20));
            lVar8 = lVar8 + -0x30;
          } while (lVar8 != 0);
        }
        operator_delete__(&pFVar2[-1].defaultVal,lVar9 * 0x30 + 0x10);
      }
      this->fStore = (Fad<long_double> *)((long)pvVar7 + 0x10);
      this->fNElements = newsize;
      this->fNAlloc = newsize;
    }
  }
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize) {
#ifndef PZNODEBUG
    //	int64_t nlongsize = 2147483647;
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
	}
#ifdef WIN32
	// Parece que o limite no windows é
	int sz = sizeof(T);
	int64_t nlongsize = 1704792168;
	if((newsize+1) > (1./sz)*nlongsize) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		std::cout << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
        //		DebugStop();
        //		return;
	}
#endif
#endif
	
	if(newsize == fNElements) return;
	if (newsize == 0) {
		fNElements = 0;
        fNAlloc = 0;
		delete[] fStore;
		fStore = nullptr;
		return;
	}
	T *newstore = new T[newsize];
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	if(fStore) delete[] fStore;
	fStore = newstore;
	fNElements = newsize;
    fNAlloc = newsize;
}